

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnData::Select
          (ColumnData *this,TransactionData transaction,idx_t vector_index,ColumnScanState *state,
          Vector *result,SelectionVector *sel,idx_t s_count)

{
  (*this->_vptr_ColumnData[9])();
  Vector::Slice(result,sel,s_count);
  return;
}

Assistant:

void ColumnData::Select(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                        SelectionVector &sel, idx_t s_count) {
	Scan(transaction, vector_index, state, result);
	result.Slice(sel, s_count);
}